

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O3

int __thiscall QSynth::open(QSynth *this,char *__file,int __oflag,...)

{
  ROMImage **controlROMImage;
  ROMImage **pcmROMImage;
  double dVar1;
  int *piVar2;
  QDebug QVar3;
  uint *puVar4;
  bool bVar5;
  AnalogOutputMode AVar6;
  int iVar7;
  uint uVar8;
  Master *pMVar9;
  ROMImage *pRVar10;
  storage_type *psVar11;
  SampleRateConverter *this_00;
  QString *in_RCX;
  undefined8 unaff_RBP;
  AnalogOutputMode AVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  SynthProfile synthProfile;
  QDebug local_1d0;
  QArrayData *local_1c8 [3];
  SamplerateConversionQuality local_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  char *local_190;
  QString local_188;
  QString local_170;
  QString local_158;
  QString local_140;
  QString local_128;
  QString local_110;
  QString local_f8;
  uint *local_e0;
  SynthProfile local_d8;
  
  iVar7 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (this->state != SynthState_OPEN) {
    if (*(long *)(in_RCX + 0x10) != 0) {
      QString::operator=(&this->synthProfileName,in_RCX);
    }
    local_1a8 = 0;
    uStack_1a4 = 0;
    uStack_1a0 = 0;
    uStack_19c = 0;
    local_198 = 0;
    uStack_194 = 0;
    QDir::QDir(&local_d8.romDir,(QString *)&local_1a8);
    piVar2 = (int *)CONCAT44(uStack_1a4,local_1a8);
    local_1ac = __oflag;
    local_e0 = (uint *)__file;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_1a4,local_1a8),2,8);
      }
    }
    local_d8.controlROMFileName.d.d = (Data *)0x0;
    local_d8.controlROMFileName.d.ptr = (char16_t *)0x0;
    local_d8.controlROMFileName.d.size = 0;
    local_d8.controlROMFileName2.d.d = (Data *)0x0;
    local_d8.controlROMFileName2.d.ptr = (char16_t *)0x0;
    local_d8.controlROMFileName2.d.size = 0;
    local_d8.pcmROMFileName.d.d = (Data *)0x0;
    local_d8.pcmROMFileName.d.ptr = (char16_t *)0x0;
    local_d8.pcmROMFileName.d.size = 0;
    local_d8.pcmROMFileName2.d.d = (Data *)0x0;
    local_d8.pcmROMFileName2.d.ptr = (char16_t *)0x0;
    local_d8.pcmROMFileName2.d.size = 0;
    controlROMImage = &this->controlROMImage;
    pcmROMImage = &this->pcmROMImage;
    do {
      pMVar9 = Master::getInstance();
      local_158.d.d = (this->synthProfileName).d.d;
      local_158.d.ptr = (this->synthProfileName).d.ptr;
      local_158.d.size = (this->synthProfileName).d.size;
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_158.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_158.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      Master::loadSynthProfile(pMVar9,&local_d8,&local_158);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
        }
      }
      if ((*controlROMImage == (ROMImage *)0x0) || (*pcmROMImage == (ROMImage *)0x0)) {
        pMVar9 = Master::getInstance();
        Master::findROMImages(pMVar9,&local_d8,controlROMImage,pcmROMImage);
        if (*controlROMImage != (ROMImage *)0x0) {
LAB_001449d0:
          if (*pcmROMImage == (ROMImage *)0x0) {
            local_128.d.d = local_d8.pcmROMFileName.d.d;
            local_128.d.ptr = local_d8.pcmROMFileName.d.ptr;
            local_128.d.size = local_d8.pcmROMFileName.d.size;
            if (&(local_d8.pcmROMFileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_d8.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_d8.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_140.d.d = local_d8.pcmROMFileName2.d.d;
            local_140.d.ptr = local_d8.pcmROMFileName2.d.ptr;
            local_140.d.size = local_d8.pcmROMFileName2.d.size;
            if (&(local_d8.pcmROMFileName2.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_d8.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_d8.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pRVar10 = makeROMImage(&local_d8.romDir,&local_128,&local_140);
            *pcmROMImage = pRVar10;
            if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,8);
              }
            }
            if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
              }
            }
          }
          goto LAB_001449db;
        }
        local_f8.d.d = local_d8.controlROMFileName.d.d;
        local_f8.d.ptr = local_d8.controlROMFileName.d.ptr;
        local_f8.d.size = local_d8.controlROMFileName.d.size;
        if (&(local_d8.controlROMFileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_d8.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_110.d.d = local_d8.controlROMFileName2.d.d;
        local_110.d.ptr = local_d8.controlROMFileName2.d.ptr;
        local_110.d.size = local_d8.controlROMFileName2.d.size;
        if (&(local_d8.controlROMFileName2.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_d8.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pRVar10 = makeROMImage(&local_d8.romDir,&local_f8,&local_110);
        *controlROMImage = pRVar10;
        if (&(local_110.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
          }
        }
        if (*controlROMImage != (ROMImage *)0x0) goto LAB_001449d0;
      }
      else {
LAB_001449db:
        puVar4 = local_e0;
        if ((*controlROMImage != (ROMImage *)0x0) && (*pcmROMImage != (ROMImage *)0x0)) {
          AVar6 = MT32Emu::SampleRateConverter::getBestAnalogOutputMode((double)*local_e0);
          AVar12 = AnalogOutputMode_OVERSAMPLED;
          if (AVar6 != AnalogOutputMode_OVERSAMPLED ||
              local_d8.analogOutputMode != AnalogOutputMode_ACCURATE) {
            AVar12 = local_d8.analogOutputMode;
          }
          MT32Emu::Synth::selectRendererType(this->synth,local_d8.rendererType);
          local_1a8 = 2;
          uStack_1a4 = 0;
          uStack_1a0 = 0;
          uStack_19c = 0;
          local_198 = 0;
          uStack_194 = 0;
          local_190 = "default";
          QMessageLogger::debug();
          QVar3.stream = local_1d0.stream;
          QVar14.m_data = (storage_type *)0x1b;
          QVar14.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar14);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_1c8);
          if (local_1c8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_1c8[0],2,8);
            }
          }
          if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
          }
          QVar3.stream = local_1d0.stream;
          psVar11 = (storage_type *)strlen(open::ANALOG_OUTPUT_MODES[AVar12]);
          QVar15.m_data = psVar11;
          QVar15.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_1c8);
          if (local_1c8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_1c8[0],2,8);
            }
          }
          if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
          }
          QDebug::~QDebug(&local_1d0);
          local_1a8 = 2;
          uStack_1a4 = 0;
          uStack_1a0 = 0;
          uStack_19c = 0;
          local_198 = 0;
          uStack_194 = 0;
          local_190 = "default";
          QMessageLogger::debug();
          QVar3.stream = local_1d0.stream;
          QVar16.m_data = (storage_type *)0x14;
          QVar16.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_1c8);
          if (local_1c8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_1c8[0],2,8);
            }
          }
          if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
          }
          QVar3.stream = local_1d0.stream;
          QVar17.m_data =
               (storage_type *)((ulong)(local_d8.rendererType == RendererType_BIT16S) * 2 + 0xc);
          QVar17.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar17);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_1c8);
          if (local_1c8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_1c8[0],2,8);
            }
          }
          if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
          }
          QDebug::~QDebug(&local_1d0);
          local_1a8 = 2;
          uStack_1a4 = 0;
          uStack_1a0 = 0;
          uStack_19c = 0;
          local_198 = 0;
          uStack_194 = 0;
          local_190 = "default";
          QMessageLogger::debug();
          QVar3.stream = local_1d0.stream;
          QVar18.m_data = (storage_type *)0x13;
          QVar18.m_size = (qsizetype)local_1c8;
          QString::fromUtf8(QVar18);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_1c8);
          if (local_1c8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_1c8[0],2,8);
            }
          }
          if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
          }
          QTextStream::operator<<((QTextStream *)local_1d0.stream,local_d8.partialCount);
          if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
          }
          QDebug::~QDebug(&local_1d0);
          dVar1 = MT32Emu::SampleRateConverter::getSupportedOutputSampleRate((double)*puVar4);
          *puVar4 = (uint)(long)dVar1;
          iVar7 = MT32Emu::Synth::open
                            (this->synth,(char *)this->controlROMImage,(int)this->pcmROMImage,
                             (ulong)(uint)local_d8.partialCount,(ulong)AVar12);
          if ((char)iVar7 != '\0') {
            if (this->state != SynthState_OPEN) {
              this->state = SynthState_OPEN;
              stateChanged(this,SynthState_OPEN);
            }
            QReportHandler::onDeviceReconfig(&this->reportHandler);
            local_188.d.d = (this->synthProfileName).d.d;
            local_188.d.ptr = (this->synthProfileName).d.ptr;
            local_188.d.size = (this->synthProfileName).d.size;
            if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_188.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_188.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            setSynthProfile(this,&local_d8,&local_188);
            if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,8);
              }
            }
            if (this->engageChannel1OnOpen == true) {
              resetMIDIChannelsAssignment(this,true);
            }
            uVar8 = *puVar4;
            if (uVar8 == 0) {
              uVar8 = MT32Emu::Synth::getStereoOutputSampleRate(this->synth);
              *puVar4 = uVar8;
            }
            this_00 = (SampleRateConverter *)operator_new(0x18);
            MT32Emu::SampleRateConverter::SampleRateConverter
                      (this_00,this->synth,(double)uVar8,local_1ac);
            this->sampleRateConverter = this_00;
            iVar7 = (int)CONCAT71((uint7)(uint3)(uVar8 >> 8),1);
            goto LAB_00145060;
          }
          createSynth(this);
          if (this->state != SynthState_CLOSED) {
            this->state = SynthState_CLOSED;
            stateChanged(this,SynthState_CLOSED);
          }
          freeROMImages(this);
          break;
        }
      }
      local_1a8 = 2;
      uStack_1a4 = 0;
      uStack_1a0 = 0;
      uStack_19c = 0;
      local_198 = 0;
      uStack_194 = 0;
      local_190 = "default";
      QMessageLogger::debug();
      QVar3.stream = local_1d0.stream;
      QVar13.m_data = (storage_type *)0x26;
      QVar13.m_size = (qsizetype)local_1c8;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_1c8);
      if (local_1c8[0] != (QArrayData *)0x0) {
        LOCK();
        (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_1c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_1c8[0],2,8);
        }
      }
      if (*(QTextStream *)(local_1d0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1d0.stream,' ');
      }
      QDebug::~QDebug(&local_1d0);
      freeROMImages(this);
      pMVar9 = Master::getInstance();
      local_170.d.d = (this->synthProfileName).d.d;
      local_170.d.ptr = (this->synthProfileName).d.ptr;
      local_170.d.size = (this->synthProfileName).d.size;
      if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_170.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_170.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar5 = Master::handleROMSLoadFailed(pMVar9,&local_170);
      if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,8);
        }
      }
    } while (bVar5);
    iVar7 = 0;
LAB_00145060:
    if (&(local_d8.pcmROMFileName2.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_d8.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.pcmROMFileName2.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_d8.pcmROMFileName2.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_d8.pcmROMFileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_d8.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.pcmROMFileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_d8.pcmROMFileName.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_d8.controlROMFileName2.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_d8.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.controlROMFileName2.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.controlROMFileName2.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_d8.controlROMFileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_d8.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.controlROMFileName.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.controlROMFileName.d.d)->super_QArrayData,2,8);
      }
    }
    QDir::~QDir(&local_d8.romDir);
  }
  return iVar7;
}

Assistant:

bool QSynth::isOpen() const {
	return state == SynthState_OPEN;
}